

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi.c
# Opt level: O3

int kvtree_sendrecv(kvtree *hash_send,int rank_send,kvtree *hash_recv,int rank_recv,MPI_Comm comm)

{
  int iVar1;
  size_t sVar2;
  char *buf;
  char cVar3;
  uint uVar4;
  char *buf_00;
  int size_send;
  int size_recv;
  char *buf_recv;
  char *buf_send;
  MPI_Request request [2];
  MPI_Status status [2];
  uint local_a8;
  int local_a4;
  char *local_a0;
  char *local_98;
  int local_8c;
  kvtree *local_88;
  kvtree *local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [56];
  
  local_8c = rank_send;
  local_80 = hash_send;
  if (rank_recv == -2) {
    uVar4 = 0;
    local_a8 = 0;
    local_a4 = 0;
    if (rank_send == -2) {
      local_98 = (char *)0x0;
      local_a0 = (char *)0x0;
      buf_00 = (char *)0x0;
      goto LAB_00107322;
    }
LAB_001071b9:
    sVar2 = kvtree_pack_size(local_80);
    if ((sVar2 & 0xffffffff80000000) != 0) {
      kvtree_abort(-1,"kvtree_sendrecv: hash size %lu is bigger than INT_MAX %d @ %s:%d",sVar2,
                   0x7fffffff,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                   ,0x7a);
    }
    local_a8 = (uint)sVar2;
    MPI_Isend(&local_a8,1,&ompi_mpi_int,rank_send,0,comm,local_78 + (ulong)uVar4 * 8);
    uVar4 = uVar4 + 1;
  }
  else {
    kvtree_unset_all(hash_recv);
    local_a8 = 0;
    local_a4 = 0;
    uVar4 = 1;
    MPI_Irecv(&local_a4,1,&ompi_mpi_int,rank_recv,0,comm,local_78);
    if (rank_send != -2) goto LAB_001071b9;
  }
  local_88 = hash_recv;
  MPI_Waitall(uVar4,local_78,local_68);
  iVar1 = local_a4;
  sVar2 = (size_t)local_a4;
  buf_00 = (char *)0x0;
  local_98 = (char *)0x0;
  local_a0 = (char *)0x0;
  if (0 < (long)sVar2) {
    buf_00 = (char *)kvtree_malloc(sVar2,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                                   ,0x8d);
    local_a0 = buf_00;
    MPI_Irecv(buf_00,local_a4,&ompi_mpi_byte,rank_recv,0,comm,local_78);
  }
  hash_recv = local_88;
  if ((int)local_a8 < 1) {
    cVar3 = '\x01';
    if (iVar1 < 1) goto LAB_00107322;
  }
  else {
    buf = (char *)kvtree_malloc((ulong)local_a8,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi.c"
                                ,0x93);
    local_98 = buf;
    kvtree_pack(buf,local_80);
    MPI_Isend(buf,local_a8,&ompi_mpi_byte,local_8c,0,comm,local_78 + (ulong)(0 < (long)sVar2) * 8);
    cVar3 = (0 < (long)sVar2) + '\x01';
  }
  MPI_Waitall(cVar3,local_78,local_68);
LAB_00107322:
  if (0 < local_a4) {
    kvtree_unpack(buf_00,hash_recv);
  }
  kvtree_free(&local_a0);
  kvtree_free(&local_98);
  return 0;
}

Assistant:

int kvtree_sendrecv(const kvtree* hash_send, int rank_send,
                            kvtree* hash_recv, int rank_recv,
                            MPI_Comm comm)
{
  int rc = KVTREE_SUCCESS;

  int num_req;
  MPI_Request request[2];
  MPI_Status  status[2];

  /* determine whether we have a rank to send to and a rank to receive from */
  int have_outgoing = 0;
  int have_incoming = 0;
  if (rank_send != MPI_PROC_NULL) {
    have_outgoing = 1;
  }
  if (rank_recv != MPI_PROC_NULL) {
    kvtree_unset_all(hash_recv);
    have_incoming = 1;
  }

  /* exchange hash pack sizes in order to allocate buffers */
  num_req = 0;
  int size_send = 0;
  int size_recv = 0;
  if (have_incoming) {
    MPI_Irecv(&size_recv, 1, MPI_INT, rank_recv, 0, comm, &request[num_req]);
    num_req++;
  }
  if (have_outgoing) {
    /* get size of packed hash and check that it doesn't exceed INT_MAX */
    size_t pack_size = kvtree_pack_size(hash_send);
    size_t max_int = (size_t) INT_MAX;
    if (pack_size > max_int) {
      kvtree_abort(-1, "kvtree_sendrecv: hash size %lu is bigger than INT_MAX %d @ %s:%d",
        (unsigned long) pack_size, INT_MAX, __FILE__, __LINE__
      );
    }

    /* tell rank how big the pack size is */
    size_send = (int) pack_size;
    MPI_Isend(&size_send, 1, MPI_INT, rank_send, 0, comm, &request[num_req]);
    num_req++;
  }
  if (num_req > 0) {
    MPI_Waitall(num_req, request, status);
  }

  /* allocate space to pack our hash and space to receive the incoming hash */
  num_req = 0;
  char* buf_send = NULL;
  char* buf_recv = NULL;
  if (size_recv > 0) {
    /* allocate space to receive a packed hash, and receive it */
    buf_recv = (char*) KVTREE_MALLOC((size_t)size_recv);
    MPI_Irecv(buf_recv, size_recv, MPI_BYTE, rank_recv, 0, comm, &request[num_req]);
    num_req++;
  }
  if (size_send > 0) {
    /* allocate space, pack our hash, and send it */
    buf_send = (char*) KVTREE_MALLOC((size_t)size_send);
    kvtree_pack(buf_send, hash_send);
    MPI_Isend(buf_send, size_send, MPI_BYTE, rank_send, 0, comm, &request[num_req]);
    num_req++;
  }
  if (num_req > 0) {
    MPI_Waitall(num_req, request, status);
  }

  /* unpack the hash into the hash_recv provided by the caller */
  if (size_recv > 0) {
    kvtree_unpack(buf_recv, hash_recv);
  }

  /* free the pack buffers */
  kvtree_free(&buf_recv);
  kvtree_free(&buf_send);

  return rc;
}